

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O1

void make_terrible(artifact *art,object *obj)

{
  int16_t *piVar1;
  int16_t *piVar2;
  bitflag *flags;
  int16_t *piVar3;
  int16_t *piVar4;
  int16_t *piVar5;
  int16_t *piVar6;
  obj_property *poVar7;
  _Bool _Var8;
  _Bool _Var9;
  int16_t iVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  int iVar13;
  uint uVar14;
  wchar_t wVar15;
  int16_t *bonus;
  object_kind *kind;
  activation **ppaVar16;
  long lVar17;
  int16_t *piVar18;
  wchar_t *pwVar19;
  int16_t *piVar20;
  ulong uVar21;
  wchar_t wVar22;
  wchar_t pick;
  int16_t *piVar23;
  int iVar24;
  ulong uVar25;
  _Bool **pp_Var26;
  ulong uVar27;
  short sVar28;
  int iVar29;
  _Bool *p_Var30;
  element_info *peVar31;
  short *psVar32;
  int iVar33;
  bool bVar34;
  
  if (art == (artifact *)0x0) {
    wVar22 = (wchar_t)obj->tval;
    wVar15 = (wchar_t)obj->sval;
  }
  else {
    wVar22 = art->tval;
    wVar15 = art->sval;
  }
  kind = lookup_kind(wVar22,wVar15);
  _Var8 = tval_is_melee_weapon_k(kind);
  bVar34 = L'ஷ' < potential;
  iVar33 = bVar34 + 1;
  if (L'ණ' < potential) {
    uVar11 = Rand_div(3);
    iVar33 = (bVar34 + 2) - (uint)(uVar11 == 0);
  }
  if (((art == (artifact *)0x0) || (art->activation == (activation *)0x0)) ||
     (uVar11 = Rand_div(3), uVar11 == 0)) {
    if (((obj == (object *)0x0) || (obj->activation == (activation *)0x0)) ||
       (uVar11 = Rand_div(3), uVar11 == 0)) goto LAB_0018fc88;
    ppaVar16 = &obj->activation;
  }
  else {
    ppaVar16 = &art->activation;
  }
  *ppaVar16 = (activation *)0x0;
LAB_0018fc88:
  uVar11 = Rand_div(2);
  if (-2 < (int)uVar11) {
    piVar1 = art->modifiers;
    piVar2 = obj->modifiers;
    flags = art->flags;
    piVar3 = art->modifiers;
    bVar34 = art != (artifact *)0x0;
    piVar4 = obj->modifiers;
    if (bVar34) {
      piVar4 = art->modifiers;
    }
    if (!bVar34) {
      flags = obj->flags;
      piVar3 = obj->modifiers;
    }
    piVar5 = art->modifiers;
    if (!bVar34) {
      piVar5 = obj->modifiers;
    }
    piVar6 = art->modifiers;
    if (!bVar34) {
      piVar6 = obj->modifiers;
    }
    iVar24 = 0;
    do {
      if ((_Var8) && (_Var9 = has_property(art,obj,"skill bonus"), _Var9)) {
        iVar29 = 2;
        uVar12 = Rand_div(2);
        if (uVar12 != 0) goto LAB_0018fd8e;
      }
      else {
LAB_0018fd8e:
        _Var9 = has_property(art,obj,"armor bonus");
        if ((_Var9) && (uVar12 = Rand_div(2), uVar12 == 0)) {
          iVar29 = 1;
        }
        else {
          uVar12 = Rand_div(2);
          iVar29 = uVar12 + 3;
        }
      }
      if (iVar29 == 3) {
        uVar12 = Rand_div(3);
        if (uVar12 == 0) {
          uVar12 = Rand_div(5);
          sVar28 = -4 - (short)uVar12;
          uVar12 = Rand_div(3);
          lVar17 = 0;
          do {
            piVar18 = piVar2;
            if (art != (artifact *)0x0) {
              piVar18 = piVar1;
            }
            *(undefined2 *)((long)piVar18 + lVar17) = 0;
            lVar17 = lVar17 + 2;
          } while (lVar17 != 0x22);
          if (uVar12 == 0) {
            sVar28 = sVar28 * 5;
          }
          uVar12 = Rand_div(5);
          if (uVar12 == 0) {
            lVar17 = 0;
            piVar18 = piVar1;
            piVar20 = piVar2;
            do {
              piVar23 = piVar20;
              if (art != (artifact *)0x0) {
                piVar23 = piVar18;
              }
              if (((uint)lVar17 < 5) && ((0x19U >> ((uint)lVar17 & 0x1f) & 1) != 0)) {
                *piVar23 = sVar28;
              }
              lVar17 = lVar17 + 1;
              piVar20 = piVar20 + 1;
              piVar18 = piVar18 + 1;
            } while (lVar17 != 5);
          }
          else {
            uVar12 = Rand_div(4);
            if (uVar12 == 0) {
              uVar14 = 0xffffffff;
              lVar17 = 0;
              do {
                piVar18 = piVar2;
                if (art != (artifact *)0x0) {
                  piVar18 = piVar1;
                }
                if (uVar14 < 2) {
                  *(short *)((long)piVar18 + lVar17) = sVar28;
                }
                lVar17 = lVar17 + 2;
                uVar14 = uVar14 + 1;
              } while (lVar17 != 10);
            }
            else {
              uVar12 = Rand_div(6);
              if (uVar12 == 0) {
                piVar4[9] = sVar28;
              }
              else {
                lVar17 = 0;
                do {
                  uVar12 = Rand_div(4);
                  if (uVar12 == 0) {
                    piVar18 = piVar2;
                    if (art != (artifact *)0x0) {
                      piVar18 = piVar1;
                    }
                    *(short *)((long)piVar18 + lVar17) = sVar28;
                  }
                  lVar17 = lVar17 + 2;
                } while (lVar17 != 10);
              }
            }
          }
          uVar12 = Rand_div(2);
          iVar33 = iVar33 + uVar12 + 1;
          if (art != (artifact *)0x0) {
            iVar13 = -60000;
            wVar22 = L'\xea60';
            goto LAB_00190266;
          }
        }
        else {
          lVar17 = 0;
          do {
            piVar18 = piVar2;
            if (art != (artifact *)0x0) {
              piVar18 = piVar1;
            }
            if (0 < *(short *)((long)piVar18 + lVar17)) {
              *(short *)((long)piVar18 + lVar17) = -*(short *)((long)piVar18 + lVar17);
            }
            lVar17 = lVar17 + 2;
          } while (lVar17 != 10);
          if (art != (artifact *)0x0) {
            iVar13 = -30000;
            wVar22 = L'田';
LAB_00190266:
            wVar15 = iVar13 + art->cost;
            if (art->cost < wVar22) {
              wVar15 = L'\0';
            }
            art->cost = wVar15;
          }
        }
      }
      else if (iVar29 == 2) {
        if (art == (artifact *)0x0) {
          uVar12 = Rand_div(2);
          if (uVar12 == 0) {
            uVar12 = Rand_div(7);
            obj->to_h = (short)uVar12 * -2 + -0xc;
            uVar12 = Rand_div(3);
            if (uVar12 != 0) {
              uVar12 = Rand_div(7);
              obj->to_d = (short)uVar12 * -2 + -0xc;
            }
          }
          else {
            if (0 < obj->to_h) {
              obj->to_h = -obj->to_h;
            }
            if (0 < obj->to_d) {
              obj->to_d = -obj->to_d;
            }
            if (((obj->to_d == 0) && (obj->to_h == 0)) && (uVar12 = Rand_div(5), uVar12 == 0)) {
              uVar12 = Rand_div(4);
              sVar28 = (short)uVar12 * 5 + 10;
              obj->to_h = obj->to_h - sVar28;
              obj->to_d = obj->to_d - sVar28;
            }
          }
        }
        else {
          _Var9 = tval_is_weapon_a(art);
          if (_Var9) {
            uVar12 = Rand_div(7);
            art->to_h = (short)uVar12 * -2 + -0xc;
            uVar12 = Rand_div(3);
            if (uVar12 != 0) {
              uVar12 = Rand_div(7);
              art->to_d = (short)uVar12 * -2 + -0xc;
            }
          }
          else {
            if (0 < art->to_h) {
              art->to_h = -art->to_h;
            }
            if (0 < art->to_d) {
              art->to_d = -art->to_d;
            }
            if (((art->to_d == 0) && (art->to_h == 0)) && (uVar12 = Rand_div(5), uVar12 == 0)) {
              uVar12 = Rand_div(4);
              sVar28 = (short)uVar12 * 5 + 10;
              art->to_h = art->to_h - sVar28;
              art->to_d = art->to_d - sVar28;
            }
          }
          if (art->to_d < 0) {
            iVar13 = -5000;
            if (art->to_h < 0) {
              iVar13 = -10000;
            }
LAB_00190060:
            art->cost = art->cost + iVar13;
          }
          else if (art->to_h < 0) {
            iVar13 = -5000;
            goto LAB_00190060;
          }
          if (art->cost < L'\0') {
            art->cost = L'\0';
          }
        }
      }
      else if (iVar29 == 1) {
        if (art == (artifact *)0x0) {
          if ((obj->ac == 0) || (uVar12 = Rand_div(6), uVar12 != 0)) {
            uVar12 = Rand_div(4);
            if (uVar12 == 0) {
              uVar12 = Rand_div(3);
              obj->to_a = (short)uVar12 * -5 + -0xf;
            }
          }
          else {
            obj->ac = 0;
          }
        }
        else {
          if ((art->ac != 0) && (uVar12 = Rand_div(6), uVar12 == 0)) {
            art->cost = art->cost + art->ac * -500;
            art->ac = 0;
          }
          if ((art->tval < L'\n') || (art->to_a < 0)) {
            uVar12 = Rand_div(4);
            if ((uVar12 == 0) && (art->tval < L'\n')) {
              uVar12 = Rand_div(3);
              art->to_a = (short)uVar12 * -5 + -0xf;
              art->cost = uVar12 * -1000 + art->cost + L'\xfffff448';
            }
          }
          else {
            uVar12 = Rand_div(7);
            art->to_a = (short)uVar12 * -2 + -0xc;
          }
          if (art->to_a < 0) {
            art->cost = art->cost + art->to_a * 400;
          }
        }
      }
      if (iVar29 == 4) {
        piVar3[10] = 0;
        uVar12 = Rand_div(4);
        if (uVar12 == 0) {
          piVar5[0xb] = 0;
        }
        uVar12 = Rand_div(4);
        if (uVar12 == 0) {
          piVar6[0xc] = 0;
        }
        uVar27 = (ulong)z_info->slay_max;
        if (z_info->slay_max != 0) {
          uVar25 = 0;
          do {
            if (art == (artifact *)0x0) {
              p_Var30 = (_Bool *)0x0;
            }
            else {
              p_Var30 = art->slays + uVar25;
              if (art->slays == (_Bool *)0x0) {
                p_Var30 = (_Bool *)0x0;
              }
            }
            if ((obj != (object *)0x0) && (obj->slays != (_Bool *)0x0)) {
              p_Var30 = obj->slays + uVar25;
            }
            uVar12 = Rand_div(3);
            if ((uVar12 == 0) && (p_Var30 != (_Bool *)0x0)) {
              *p_Var30 = false;
            }
            uVar25 = uVar25 + 1;
            uVar27 = (ulong)z_info->slay_max;
          } while (uVar25 < uVar27);
        }
        if ((char)uVar27 == '\0') {
          uVar25 = 0;
        }
        else {
          uVar21 = 0;
          do {
            uVar25 = uVar21;
            if ((((art != (artifact *)0x0) && (art->slays != (_Bool *)0x0)) &&
                (art->slays[uVar21] != false)) ||
               (((obj != (object *)0x0 && (obj->slays != (_Bool *)0x0)) &&
                (obj->slays[uVar21] != false)))) break;
            uVar21 = uVar21 + 1;
            uVar25 = uVar27;
          } while (uVar27 != uVar21);
        }
        if (((art != (artifact *)0x0) && (pp_Var26 = &art->slays, (int)uVar25 == (int)uVar27)) ||
           ((obj != (object *)0x0 && (pp_Var26 = &obj->slays, (int)uVar25 == (int)uVar27)))) {
          mem_free(*pp_Var26);
          *pp_Var26 = (_Bool *)0x0;
        }
        uVar12 = Rand_div(3);
        if (uVar12 == 0) {
          flag_off(flags,6,0x2a);
        }
        uVar27 = (ulong)z_info->brand_max;
        if (z_info->brand_max != 0) {
          uVar25 = 0;
          do {
            if (art == (artifact *)0x0) {
              p_Var30 = (_Bool *)0x0;
            }
            else {
              p_Var30 = art->brands + uVar25;
              if (art->brands == (_Bool *)0x0) {
                p_Var30 = (_Bool *)0x0;
              }
            }
            if ((obj != (object *)0x0) && (obj->brands != (_Bool *)0x0)) {
              p_Var30 = obj->brands + uVar25;
            }
            uVar12 = Rand_div(3);
            if ((uVar12 == 0) && (p_Var30 != (_Bool *)0x0)) {
              *p_Var30 = false;
            }
            uVar25 = uVar25 + 1;
            uVar27 = (ulong)z_info->brand_max;
          } while (uVar25 < uVar27);
        }
        if ((char)uVar27 == '\0') {
          uVar25 = 0;
        }
        else {
          uVar21 = 0;
          while (((uVar25 = uVar21, art == (artifact *)0x0 || (art->brands == (_Bool *)0x0)) ||
                 (art->brands[uVar21] == false))) {
            if ((((obj != (object *)0x0) && (obj->brands != (_Bool *)0x0)) &&
                (obj->brands[uVar21] != false)) ||
               (uVar21 = uVar21 + 1, uVar25 = uVar27, uVar27 == uVar21)) break;
          }
        }
        if (((art != (artifact *)0x0) && (pp_Var26 = &art->brands, (int)uVar25 == (int)uVar27)) ||
           ((obj != (object *)0x0 && (pp_Var26 = &obj->brands, (int)uVar25 == (int)uVar27)))) {
          mem_free(*pp_Var26);
          *pp_Var26 = (_Bool *)0x0;
        }
        lVar17 = 0;
        do {
          peVar31 = obj->el_info;
          if (art != (artifact *)0x0) {
            peVar31 = art->el_info;
          }
          uVar12 = Rand_div(3);
          if (uVar12 == 0) {
            psVar32 = (short *)((long)&peVar31->res_level + lVar17);
            sVar28 = *psVar32;
            if (sVar28 < 100) {
              *psVar32 = 200 - sVar28;
            }
          }
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x34);
        if (z_info->property_max == 0) {
          uVar27 = 0;
        }
        else {
          lVar17 = 0x14;
          uVar27 = 0;
          do {
            poVar7 = obj_properties;
            uVar12 = Rand_div(3);
            if (((uVar12 == 0) && (*(int *)((long)poVar7->type_mult + lVar17 + -0x2c) == 3)) &&
               ((*(uint *)((long)poVar7->type_mult + lVar17 + -0x28) & 0xfffffffe) == 2)) {
              flag_off(flags,6,*(int *)((long)poVar7->type_mult + lVar17 + -0x20));
            }
            uVar27 = uVar27 + 1;
            lVar17 = lVar17 + 0xf0;
          } while (uVar27 < z_info->property_max);
        }
        iVar24 = (int)uVar27;
        if ((art != (artifact *)0x0) && (L'\0' < art->cost)) {
          art->cost = (uint)art->cost / 3;
        }
      }
      bVar34 = iVar24 <= (int)uVar11;
      iVar24 = iVar24 + 1;
    } while (bVar34);
  }
  if ((art != (artifact *)0x0) && (art->cost < L'\0')) {
    art->cost = L'\0';
  }
  if (iVar33 != 0) {
    do {
      if (art == (artifact *)0x0) {
        pwVar19 = &obj->kind->alloc_min;
        wVar22 = (wchar_t)obj->tval;
      }
      else {
        wVar22 = art->tval;
        pwVar19 = &art->alloc_min;
      }
      wVar15 = *pwVar19;
      uVar11 = Rand_div(z_info->curse_max - 1);
      pick = uVar11 + L'\x01';
      uVar11 = Rand_div(9);
      iVar10 = m_bonus(9,wVar15);
      if (curses[pick].poss[wVar22] == true) {
        wVar22 = uVar11 + iVar10 * 10 + L'\x01';
        if (art == (artifact *)0x0) {
          append_object_curse(obj,pick,wVar22);
        }
        else {
          append_artifact_curse(art,pick,wVar22);
        }
        iVar33 = iVar33 + -1;
      }
    } while (iVar33 != 0);
  }
  return;
}

Assistant:

static void make_terrible(struct artifact *art, struct object *obj)
{
	int i, gauntlet_runs;
	int num_curses = 1;
	struct object_kind *kind = art ? lookup_kind(art->tval, art->sval) :
		lookup_kind(obj->tval, obj->sval);
	bool weapon = tval_is_melee_weapon_k(kind);

	/* Determine whether the artifact's magics are perilous enough to warrant
	 * extra curses. */
	if (potential >= 3000) {
		num_curses++;
	}
	if ((potential >= 3500) && !one_in_(3)) {
		num_curses++;
	}

	/* Greatly decrease the chance for an activation. */
	if (art && art->activation && !one_in_(3)) {
		art->activation = NULL;
	} else if (obj && obj->activation && !one_in_(3)) {
		obj->activation = NULL;
	}

	/* Force the artifact though the gauntlet two or three times. */
	gauntlet_runs = 1 + randint1(2);
	for (i = 0; i < gauntlet_runs; i++) {
		int j, wheel_of_doom, penalty = 0;

		/* Choose a curse, biased towards penalties to_a, to_d, and to_h. */
		if (weapon && has_property(art, obj, "skill bonus") && one_in_(2)) {
			wheel_of_doom = 2;
		} else if (has_property(art, obj, "armor bonus") && one_in_(2)) {
			wheel_of_doom = 1;
		} else {
			wheel_of_doom = 2 + randint1(2);
		}
		/* Blast base armour class or inflict a penalty to armour class. */
		if (wheel_of_doom == 1) {

			if (art) {
				/* Blast armour and twist magics. */
				if ((art->ac) && (one_in_(6))) {
					art->cost -= 500L * art->ac;
					art->ac = 0;
				}
				if ((art->tval >= TV_BOOTS) && (art->to_a >= 0)) {
					art->to_a = -(5 + randint1(7)) * 2;
				} else if ((one_in_(4)) && (art->tval < TV_BOOTS)) {
					/* Chance of a truly nasty effect for weapons. */
					penalty = randint1(3) + 2;
					penalty *= 5;
					art->to_a = -penalty;
					art->cost -= penalty * 200L;
				}

				/* Artifact might very well still have some value. */
				if (art->to_a < 0) {
					art->cost += art->to_a * 400L;
				}
			} else {
				/* Invert armour class. */
				if ((obj->ac) && (randint1(6) == 1)) {
					obj->ac = 0;
				} else if (randint1(4) == 1) {
					/* Chance of a truly nasty effect. */
					penalty = randint1(3) + 2;
					penalty *= 5;
					obj->to_a = -penalty;
				}
			}
		}

		/* Make either the Skill or Deadliness bonus negative, or both. */
		if (wheel_of_doom == 2) {

			if (art) {
				/* Weapons. */
				if (tval_is_weapon_a(art)) {
					/* Blast items with bonuses, Deadliness more rarely. */
					art->to_h = -(5 + randint1(7)) * 2;
					if (!one_in_(3)) {
						art->to_d = -(5 + randint1(7)) * 2;
					}
				} else {
					/* All armours. */

					/* Reverse any magics. */
					if (art->to_h > 0) {
						art->to_h = -art->to_h;
					}
					if (art->to_d > 0) {
						art->to_d = -art->to_d;
					}

					/* Sometimes, blast even items without bonuses. */
					if (!art->to_d && !art->to_h && one_in_(5)) {
						penalty = randint1(4) + 1;
						penalty *= 5;
						art->to_h -= penalty;
						art->to_d -= penalty;
					}
				}

				/* Artifact might very well still have some value. */
				if ((art->to_d < 0) && (art->to_h < 0)) {
					art->cost -= 10000L;
				} else if ((art->to_d < 0) || (art->to_h < 0)) {
					art->cost -= 5000L;
				}
				if (art->cost < 0) {
					art->cost = 0;
				}
			} else {
				if (randint1(2) == 1) {
					/* One type of badness... */
					/* Blast items with bonuses, Deadliness more rarely. */
					obj->to_h = -(5 + randint1(7)) * 2;
					if (!one_in_(3)) {
						obj->to_d = -(5 + randint1(7)) * 2;
					}
				} else {
					/* ...or another. */
					/* Reverse any magics. */
					if (obj->to_h > 0) {
						obj->to_h = -obj->to_h;
					}
					if (obj->to_d > 0) {
						obj->to_d = -obj->to_d;
					}

					/* Sometimes, blast even items without bonuses. */
					if (!obj->to_d && !obj->to_h && one_in_(5)) {
						penalty = randint1(4) + 1;
						penalty *= 5;
						obj->to_h -= penalty;
						obj->to_d -= penalty;
					}
				}
			}
		}

		/* Make any bonuses negative, or strip all bonuses, and add a random
		 * stat or three with large negative bonuses. */
		if (wheel_of_doom == 3) {
			if (!one_in_(3)) {
				for (j = 0; j < STAT_MAX; j++) {
					int16_t *bonus = art ? &art->modifiers[j] : &obj->modifiers[j];
					if ((*bonus) > 0) {
						*bonus = -(*bonus);
					}
				}

				/* Artifact is highly unlikely to have any value. */
				if (art) {
					art->cost = MAX(art->cost - 30000L, 0);
				}
			} else {
				/* Iron Crown of Beruthiel, here we come... */
				penalty = -(randint1(5)) - 3;
				if (one_in_(3)) {
					penalty *= 5;
				}
				for (j = 0; j < OBJ_MOD_MAX; j++) {
					int16_t *bonus = art ? &art->modifiers[j] : &obj->modifiers[j];
					*bonus = 0;
				}
				if (one_in_(5)) {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (j == OBJ_MOD_STR) *bonus = penalty;
						if (j == OBJ_MOD_DEX) *bonus = penalty;
						if (j == OBJ_MOD_CON) *bonus = penalty;
					}
				} else if (one_in_(4)) {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (j == OBJ_MOD_WIS) *bonus = penalty;
						if (j == OBJ_MOD_INT) *bonus = penalty;
					}
				} else if (one_in_(6)) {
					int16_t *bonus = art ? &art->modifiers[OBJ_MOD_SPEED] :
						&obj->modifiers[OBJ_MOD_SPEED];
					*bonus = penalty;
				} else {
					for (j = 0; j < STAT_MAX; j++) {
						int16_t *bonus = art ? &art->modifiers[j] :
							&obj->modifiers[j];
						if (one_in_(4)) {
							*bonus = penalty;
						}
					}
				}

				/* More curses for good measure... */
				num_curses += randint1(2);

				/* Artifact is highly unlikely to have any value. */
				if (art) {
					art->cost = MAX(art->cost - 60000L, 0);
				}
			}
		}

		/* Strip lots of other qualities. */
		if (wheel_of_doom == 4) {
			bitflag *flags = art ? art->flags : obj->flags;

			/* Powerful modifiers */
			if (art) {
				art->modifiers[OBJ_MOD_BLOWS] = 0;
			} else {
				obj->modifiers[OBJ_MOD_BLOWS] = 0;
			}
			if (one_in_(4)) {
				if (art) {
					art->modifiers[OBJ_MOD_SHOTS] = 0;
				} else {
					obj->modifiers[OBJ_MOD_SHOTS] = 0;
				}
			}
			if (one_in_(4)) {
				if (art) {
					art->modifiers[OBJ_MOD_MIGHT] = 0;
				} else {
					obj->modifiers[OBJ_MOD_MIGHT] = 0;
				}
			}

			/* Slays */
			for (i = 0; i < z_info->slay_max; i++) {
				bool *slay = NULL;
				if (art && art->slays) slay = &art->slays[i];
				if (obj && obj->slays) slay = &obj->slays[i];
				if (one_in_(3) && slay) *slay = false;
			}
			for (i = 0; i < z_info->slay_max; i++) {
				if (art && art->slays && art->slays[i]) break;
				if (obj && obj->slays && obj->slays[i]) break;
			}
			if (art && (i == z_info->slay_max)) {
				mem_free(art->slays);
				art->slays = NULL;
			} else if (obj && (i == z_info->slay_max)) {
				mem_free(obj->slays);
				obj->slays = NULL;
			}
			if (one_in_(3)) {
				of_off(flags, OF_PERFECT_BALANCE);
			}

			/* Brands */
			for (i = 0; i < z_info->brand_max; i++) {
				bool *brand = NULL;
				if (art && art->brands) brand = &art->brands[i];
				if (obj && obj->brands) brand = &obj->brands[i];
				if (one_in_(3) && brand) *brand = false;
			}
			for (i = 0; i < z_info->brand_max; i++) {
				if (art && art->brands && art->brands[i]) break;
				if (obj && obj->brands && obj->brands[i]) break;
			}
			if (art && (i == z_info->brand_max)) {
				mem_free(art->brands);
				art->brands = NULL;
			} else if (obj && (i == z_info->brand_max)) {
				mem_free(obj->brands);
				obj->brands = NULL;
			}

			/* Resists */
			for (i = 0; i < ELEM_HIGH_MAX; i++) {
				int16_t *level = art ? &art->el_info[i].res_level :
					&obj->el_info[i].res_level;
				if (one_in_(3) && (*level < RES_LEVEL_BASE)) {
					*level += 2 * (RES_LEVEL_BASE - *level);
				}
			}

			/* Flags */
			for (i = 0; i < z_info->property_max; i++) {
				struct obj_property *prop = &obj_properties[i];
				if (one_in_(3) && (prop->type == OBJ_PROPERTY_FLAG) &&
					(prop->subtype == OFT_PROT || prop->subtype == OFT_MISC)) {
					of_off(flags, prop->index);
				}
			}

			/* Artifact will still have some value. */
			if (art && art->cost > 0) {
				art->cost /= 3L;
			}
		}
	}

	/* Boundary control. */
	if (art && art->cost < 0) {
		art->cost = 0;
	}

	/* Apply curses. */
	while (num_curses) {
		int level = art ? art->alloc_min : obj->kind->alloc_min;
		int tval = art ? art->tval : obj->tval;
		int pick = randint1(z_info->curse_max - 1);
		int power = randint1(9) + 10 * m_bonus(9, level);
		if (!curses[pick].poss[tval]) {
			continue;
		}
		if (art) {
			append_artifact_curse(art, pick, power);
		} else {
			append_object_curse(obj, pick, power);
		}
		num_curses--;
	}
}